

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O1

void __thiscall wasm::Instrumenter::addSecondaryMemory(Instrumenter *this,size_t numFuncs)

{
  InstrumenterConfig *pIVar1;
  char *pcVar2;
  string_view sVar3;
  Name root;
  undefined1 auStack_1b8 [8];
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> mem;
  
  pIVar1 = this->config;
  if (pIVar1->storageKind == InSecondaryMemory) {
    auStack_1b8 = (undefined1  [8])this->wasm;
    if (((((Module *)auStack_1b8)->features).features & 0x10000) == 0) {
      Fatal::Fatal((Fatal *)auStack_1b8);
      Fatal::operator<<((Fatal *)auStack_1b8,
                        (char (*) [67])
                        "error: --in-secondary-memory requires multi-memories to be enabled");
      Fatal::~Fatal((Fatal *)auStack_1b8);
    }
    mem._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
         (__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)0x0;
    root.super_IString.str._M_str = auStack_1b8;
    root.super_IString.str._M_len = (size_t)(pIVar1->secondaryMemoryName).super_IString.str._M_str;
    sVar3 = (string_view)
            Names::getValidName((Names *)(pIVar1->secondaryMemoryName).super_IString.str._M_len,root
                                ,(function<bool_(wasm::Name)> *)auStack_1b8);
    std::
    _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:92:23)>
    ::_M_manager((_Any_data *)auStack_1b8,(_Any_data *)auStack_1b8,__destroy_functor);
    (this->secondaryMemory).super_IString.str = sVar3;
    pcVar2 = (char *)(numFuncs + 0xffff >> 0x10);
    auStack_1b8 = (undefined1  [8])operator_new(0x58);
    ((string_view *)((long)auStack_1b8 + 0x40))->_M_len = 0;
    ((string_view *)((long)auStack_1b8 + 0x40))->_M_str = (char *)0x0;
    ((string_view *)auStack_1b8)->_M_len = 0;
    ((string_view *)auStack_1b8)->_M_str = (char *)0x0;
    ((string_view *)((long)auStack_1b8 + 0x10))->_M_len = 0;
    ((string_view *)((long)auStack_1b8 + 0x10))->_M_str = (char *)0x0;
    ((string_view *)((long)auStack_1b8 + 0x20))->_M_len = 0;
    ((string_view *)((long)auStack_1b8 + 0x20))->_M_str = (char *)0x0;
    ((string_view *)((long)auStack_1b8 + 0x30))->_M_len = 0;
    ((string_view *)((long)auStack_1b8 + 0x30))->_M_str = (char *)0x0;
    ((string_view *)((long)auStack_1b8 + 0x40))->_M_len = 0x10000;
    *(undefined1 *)&((string_view *)((long)auStack_1b8 + 0x40))->_M_str = 0;
    ((string_view *)((long)auStack_1b8 + 0x50))->_M_len = 2;
    *(string_view *)auStack_1b8 = sVar3;
    ((string_view *)((long)auStack_1b8 + 0x30))->_M_str = pcVar2;
    ((string_view *)((long)auStack_1b8 + 0x40))->_M_len = (size_t)pcVar2;
    *(undefined1 *)&((string_view *)((long)auStack_1b8 + 0x40))->_M_str = 1;
    ((string_view *)((long)auStack_1b8 + 0x50))->_M_len = 2;
    pIVar1 = this->config;
    pcVar2 = (pIVar1->importNamespace).super_IString.str._M_str;
    ((string_view *)((long)auStack_1b8 + 0x10))->_M_str =
         (char *)(pIVar1->importNamespace).super_IString.str._M_len;
    ((string_view *)((long)auStack_1b8 + 0x20))->_M_len = (size_t)pcVar2;
    pcVar2 = (pIVar1->secondaryMemoryName).super_IString.str._M_str;
    ((string_view *)((long)auStack_1b8 + 0x20))->_M_str =
         (char *)(pIVar1->secondaryMemoryName).super_IString.str._M_len;
    ((string_view *)((long)auStack_1b8 + 0x30))->_M_len = (size_t)pcVar2;
    wasm::Module::addMemory((unique_ptr *)this->wasm);
    if (auStack_1b8 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_1b8,0x58);
    }
  }
  return;
}

Assistant:

void Instrumenter::addSecondaryMemory(size_t numFuncs) {
  if (config.storageKind != WasmSplitOptions::StorageKind::InSecondaryMemory) {
    // Don't need secondary memory
    return;
  }
  if (!wasm->features.hasMultiMemories()) {
    Fatal()
      << "error: --in-secondary-memory requires multi-memories to be enabled";
  }

  secondaryMemory =
    Names::getValidMemoryName(*wasm, config.secondaryMemoryName);
  // Create a memory with enough pages to write into
  size_t pages = (numFuncs + Memory::kPageSize - 1) / Memory::kPageSize;
  auto mem = Builder::makeMemory(secondaryMemory, pages, pages, true);
  mem->module = config.importNamespace;
  mem->base = config.secondaryMemoryName;
  wasm->addMemory(std::move(mem));
}